

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float *pfVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  float fVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar16;
  binary_op_pow op;
  int local_88;
  __m128 _p1;
  __m128 _p;
  
  uVar2 = a->c;
  iVar7 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  local_88 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    local_88 = 0;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (uVar11 = 0; uVar11 != uVar2; uVar11 = uVar11 + 1) {
      lVar14 = a->elemsize * a->cstep * uVar11;
      pvVar3 = a->data;
      lVar8 = b->elemsize * b->cstep * uVar11;
      pvVar4 = b->data;
      lVar12 = c->elemsize * c->cstep * uVar11;
      pvVar5 = c->data;
      lVar9 = 0;
      lVar10 = 0;
      for (iVar13 = 0; iVar13 + 3 < iVar7; iVar13 = iVar13 + 4) {
        pfVar1 = (float *)((long)pvVar3 + lVar10 + lVar14);
        _p._0_8_ = *(undefined8 *)pfVar1;
        _p._8_8_ = *(undefined8 *)(pfVar1 + 2);
        pfVar1 = (float *)((long)pvVar4 + lVar10 + lVar8);
        _p1._0_8_ = *(undefined8 *)pfVar1;
        _p1._8_8_ = *(undefined8 *)(pfVar1 + 2);
        afVar16 = BinaryOp_x86_functor::binary_op_pow::func_pack4(&op,&_p,&_p1);
        auVar6._8_4_ = extraout_XMM0_Dc;
        auVar6._0_8_ = afVar16._0_8_;
        auVar6._12_4_ = extraout_XMM0_Dd;
        *(undefined1 (*) [16])((long)pvVar5 + lVar10 + lVar12) = auVar6;
        lVar10 = lVar10 + 0x10;
        lVar9 = lVar9 + 4;
      }
      for (; (int)lVar9 < iVar7; lVar9 = lVar9 + 1) {
        fVar15 = powf(*(float *)((long)pvVar3 + lVar9 * 4 + lVar14),
                      *(float *)((long)pvVar4 + lVar9 * 4 + lVar8));
        *(float *)((long)pvVar5 + lVar9 * 4 + lVar12) = fVar15;
      }
    }
  }
  return local_88;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}